

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_construct_any_const.cpp
# Opt level: O0

int main(void)

{
  double *pdVar1;
  any local_38;
  any b;
  double local_20;
  any local_18;
  any a;
  
  a._value._4_4_ = 0;
  local_20 = 3.14159;
  type::any::any<double>(&local_18,&local_20);
  type::any::any(&local_38,&local_18);
  pdVar1 = type::any::as<double>(&local_38);
  if ((*pdVar1 != 3.14159) || (NAN(*pdVar1))) {
    a._value._4_4_ = -1;
  }
  else {
    a._value._4_4_ = 0;
  }
  type::any::~any(&local_38);
  type::any::~any(&local_18);
  return a._value._4_4_;
}

Assistant:

int main() {
  try {
    type::any a(3.14159);
    type::any b(a);
    if(b.as<double>() == 3.14159) {
      return 0;
    }
    return -1;
  }
  catch(...) {
    return -1;
  }
}